

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall chrono::ChConstraintThreeBBShaft::Update_auxiliary(ChConstraintThreeBBShaft *this)

{
  double dVar1;
  ChVariables *pCVar2;
  double dVar3;
  Scalar SVar4;
  Scalar SVar5;
  ChRowVectorN<double,_6> *local_98;
  ChRowVectorN<double,_6> *local_90;
  ChVectorN<double,_6> *local_88;
  void *local_78;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_68 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_50 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_38 [24];
  
  pCVar2 = (this->super_ChConstraintThree).variables_a;
  if (pCVar2->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,6,1,0,6,1>>
              (local_38,&(this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,
               (type *)0x0);
    local_98 = &this->Cq_a;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_90,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_> *)&local_98,
               (type *)0x0);
    (*pCVar2->_vptr_ChVariables[4])
              (pCVar2,local_38,
               (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_90);
    Eigen::internal::handmade_aligned_free(local_78);
  }
  pCVar2 = (this->super_ChConstraintThree).variables_b;
  if (pCVar2->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,6,1,0,6,1>>
              (local_50,&(this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,
               (type *)0x0);
    local_98 = &this->Cq_b;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_90,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_> *)&local_98,
               (type *)0x0);
    (*pCVar2->_vptr_ChVariables[4])
              (pCVar2,local_50,
               (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_90);
    Eigen::internal::handmade_aligned_free(local_78);
  }
  pCVar2 = (this->super_ChConstraintThree).variables_c;
  if (pCVar2->disabled == false) {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,1,1,0,1,1>>
              (local_68,&(this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,
               (type *)0x0);
    local_98 = (ChRowVectorN<double,_6> *)&this->Cq_c;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Transpose<Eigen::Matrix<double,1,1,1,1,1>>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_90,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>_> *)&local_98,
               (type *)0x0);
    (*pCVar2->_vptr_ChVariables[4])
              (pCVar2,local_68,
               (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_90);
    Eigen::internal::handmade_aligned_free(local_78);
  }
  (this->super_ChConstraintThree).super_ChConstraint.g_i = 0.0;
  dVar3 = 0.0;
  if (((this->super_ChConstraintThree).variables_a)->disabled == false) {
    local_90 = &this->Cq_a;
    local_88 = &this->Eq_a;
    SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_90);
    dVar3 = SVar4 + (this->super_ChConstraintThree).super_ChConstraint.g_i;
    (this->super_ChConstraintThree).super_ChConstraint.g_i = dVar3;
  }
  if (((this->super_ChConstraintThree).variables_b)->disabled == false) {
    local_90 = &this->Cq_b;
    local_88 = &this->Eq_b;
    SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_90);
    dVar3 = SVar4 + (this->super_ChConstraintThree).super_ChConstraint.g_i;
    (this->super_ChConstraintThree).super_ChConstraint.g_i = dVar3;
  }
  if (((this->super_ChConstraintThree).variables_c)->disabled == false) {
    local_90 = (ChRowVectorN<double,_6> *)&this->Cq_c;
    local_88 = (ChVectorN<double,_6> *)&this->Eq_c;
    SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_90);
    dVar3 = SVar5 + (this->super_ChConstraintThree).super_ChConstraint.g_i;
    (this->super_ChConstraintThree).super_ChConstraint.g_i = dVar3;
  }
  dVar1 = (this->super_ChConstraintThree).super_ChConstraint.cfm_i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (this->super_ChConstraintThree).super_ChConstraint.g_i = dVar1 + dVar3;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::Update_auxiliary() {
    // 1- Assuming jacobians are already computed, now compute
    //   the matrices [Eq_a]=[invM_a]*[Cq_a]'  etc
    if (variables_a->IsActive()) {
        variables_a->Compute_invMb_v(Eq_a, Cq_a.transpose());
    }
    if (variables_b->IsActive()) {
        variables_b->Compute_invMb_v(Eq_b, Cq_b.transpose());
    }
    if (variables_c->IsActive()) {
        variables_c->Compute_invMb_v(Eq_c, Cq_c.transpose());
    }

    // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
    g_i = 0;
    if (variables_a->IsActive()) {
        g_i += Cq_a * Eq_a;
    }
    if (variables_b->IsActive()) {
        g_i += Cq_b * Eq_b;
    }
    if (variables_c->IsActive()) {
        g_i += Cq_c * Eq_c;
    }

    // 3- adds the constraint force mixing term (usually zero):
    if (cfm_i)
        g_i += cfm_i;
}